

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O1

bool anon_unknown.dwarf_f0d44::checkPixels<unsigned_int>
               (Array2D<unsigned_int> *sampleCount,Array2D<unsigned_int_*> *ph,int width,int height)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ostream *poVar4;
  long *plVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  
  bVar12 = height < 1;
  if (0 < height) {
    uVar9 = 0;
    bVar12 = false;
    do {
      if (0 < width) {
        bVar10 = false;
        uVar7 = 0;
        do {
          uVar3 = (ulong)sampleCount->_data[sampleCount->_sizeY * uVar9 + uVar7];
          if (uVar3 != 0) {
            uVar6 = ((int)uVar9 * width + (int)uVar7) % 0x801;
            if (*ph->_data[ph->_sizeY * uVar9 + uVar7] == uVar6) {
              uVar8 = 0;
              do {
                if (uVar3 - 1 == uVar8) goto LAB_0014d1e4;
                uVar1 = uVar8 + 1;
                lVar2 = uVar8 + 1;
                uVar8 = uVar1;
              } while (ph->_data[ph->_sizeY * uVar9 + uVar7][lVar2] == uVar6);
              bVar11 = uVar1 < uVar3;
            }
            else {
              bVar11 = true;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar4 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", sample ",9);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", should be ",0xc);
            plVar5 = (long *)std::ostream::operator<<(poVar4,uVar6);
            std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
            std::ostream::put((char)plVar5);
            std::ostream::flush();
            std::ostream::flush();
            if (bVar11) {
              if (!bVar10) {
                return bVar12;
              }
              break;
            }
          }
LAB_0014d1e4:
          uVar3 = uVar7 + 1;
          bVar10 = (long)(width + -1) <= (long)uVar7;
          uVar7 = uVar3;
        } while (uVar3 != (uint)width);
      }
      bVar12 = height - 1 <= uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)height);
  }
  return bVar12;
}

Assistant:

bool
checkPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    return checkPixels<T> (sampleCount, ph, 0, width - 1, 0, height - 1, width);
}